

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O3

void __thiscall
Equality_unitsNotEqualImportedUnits_Test::TestBody(Equality_unitsNotEqualImportedUnits_Test *this)

{
  byte bVar1;
  char cVar2;
  AssertionResult gtest_ar_;
  UnitsPtr u1;
  UnitsPtr u2;
  ImportSourcePtr iS;
  long *local_80;
  AssertHelper local_78 [8];
  AssertionResult local_70;
  long local_60 [2];
  byte local_50 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  shared_ptr *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  shared_ptr *local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  local_70._0_8_ = (shared_ptr *)local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"name","");
  libcellml::Units::create((string *)&local_40);
  if ((shared_ptr *)local_70._0_8_ != (shared_ptr *)local_60) {
    operator_delete((void *)local_70._0_8_,local_60[0] + 1);
  }
  local_70._0_8_ = (shared_ptr *)local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"name","");
  libcellml::Units::create((string *)&local_30);
  if ((shared_ptr *)local_70._0_8_ != (shared_ptr *)local_60) {
    operator_delete((void *)local_70._0_8_,local_60[0] + 1);
  }
  libcellml::ImportSource::create();
  libcellml::ImportedEntity::setImportSource(local_40 + 0x10);
  local_70._0_8_ = local_30;
  local_70.message_.ptr_ = local_28;
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_28->_M_string_length = (int)local_28->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_28->_M_string_length = (int)local_28->_M_string_length + 1;
    }
  }
  bVar1 = libcellml::Entity::equals(local_40);
  local_50[0] = bVar1 ^ 1;
  local_48.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_70.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (bVar1 != 0) goto LAB_001240e9;
  }
  else {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70.message_.ptr_);
    if ((local_50[0] & 1) == 0) {
LAB_001240e9:
      testing::Message::Message((Message *)&local_80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_70,(char *)local_50,"u1->equals(u2)","true");
      testing::internal::AssertHelper::AssertHelper
                (local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
                 ,0x40f,(char *)local_70._0_8_);
      testing::internal::AssertHelper::operator=(local_78,(Message *)&local_80);
      testing::internal::AssertHelper::~AssertHelper(local_78);
      if ((shared_ptr *)local_70._0_8_ != (shared_ptr *)local_60) {
        operator_delete((void *)local_70._0_8_,local_60[0] + 1);
      }
      if (((local_80 != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0')) &&
         (local_80 != (long *)0x0)) {
        (**(code **)(*local_80 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_70._0_8_ = local_40;
  local_70.message_.ptr_ = local_38;
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_38->_M_string_length = (int)local_38->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_38->_M_string_length = (int)local_38->_M_string_length + 1;
    }
  }
  bVar1 = libcellml::Entity::equals(local_30);
  local_50[0] = bVar1 ^ 1;
  local_48.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_70.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (bVar1 == 0) goto LAB_001242af;
  }
  else {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70.message_.ptr_);
    if ((local_50[0] & 1) != 0) goto LAB_001242af;
  }
  testing::Message::Message((Message *)&local_80);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_70,(char *)local_50,"u2->equals(u1)","true");
  testing::internal::AssertHelper::AssertHelper
            (local_78,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
             ,0x410,(char *)local_70._0_8_);
  testing::internal::AssertHelper::operator=(local_78,(Message *)&local_80);
  testing::internal::AssertHelper::~AssertHelper(local_78);
  if ((shared_ptr *)local_70._0_8_ != (shared_ptr *)local_60) {
    operator_delete((void *)local_70._0_8_,local_60[0] + 1);
  }
  if (((local_80 != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0')) &&
     (local_80 != (long *)0x0)) {
    (**(code **)(*local_80 + 8))();
  }
LAB_001242af:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28);
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
  }
  return;
}

Assistant:

TEST(Equality, unitsNotEqualByUnitIdOnly)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create("unitsA");
    libcellml::UnitsPtr u2 = libcellml::Units::create("unitsA");

    u1->addUnit("second");
    u2->addUnit("second");

    u1->setUnitId(0, "UnitsASecond");

    EXPECT_NE(u1, u2);
    EXPECT_FALSE(u1->equals(u2));
    EXPECT_FALSE(u2->equals(u1));
    EXPECT_TRUE(libcellml::Units::equivalent(u1, u2));
}